

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

void __thiscall
Solver_MCSVM_CS::solve_sub_problem
          (Solver_MCSVM_CS *this,double A_i,int yi,double C_yi,int active_i,double *alpha_new)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double local_50;
  double beta;
  double *D;
  double *pdStack_38;
  int r;
  double *alpha_new_local;
  double dStack_28;
  int active_i_local;
  double C_yi_local;
  double dStack_18;
  int yi_local;
  double A_i_local;
  Solver_MCSVM_CS *this_local;
  
  pdStack_38 = alpha_new;
  alpha_new_local._4_4_ = active_i;
  dStack_28 = C_yi;
  C_yi_local._4_4_ = yi;
  dStack_18 = A_i;
  A_i_local = (double)this;
  clone<double,double>((double **)&beta,this->B,active_i);
  if (C_yi_local._4_4_ < alpha_new_local._4_4_) {
    *(double *)((long)beta + (long)C_yi_local._4_4_ * 8) =
         dStack_18 * dStack_28 + *(double *)((long)beta + (long)C_yi_local._4_4_ * 8);
  }
  qsort((void *)beta,(long)alpha_new_local._4_4_,8,compare_double);
  local_50 = -dStack_18 * dStack_28 + *(double *)beta;
  D._4_4_ = 1;
  while( true ) {
    bVar1 = false;
    if (D._4_4_ < alpha_new_local._4_4_) {
      bVar1 = local_50 < (double)D._4_4_ * *(double *)((long)beta + (long)D._4_4_ * 8);
    }
    if (!bVar1) break;
    local_50 = *(double *)((long)beta + (long)D._4_4_ * 8) + local_50;
    D._4_4_ = D._4_4_ + 1;
  }
  dVar3 = (double)D._4_4_;
  for (D._4_4_ = 0; D._4_4_ < alpha_new_local._4_4_; D._4_4_ = D._4_4_ + 1) {
    if (D._4_4_ == C_yi_local._4_4_) {
      dVar2 = min<double>(dStack_28,(local_50 / dVar3 - this->B[D._4_4_]) / dStack_18);
      pdStack_38[D._4_4_] = dVar2;
    }
    else {
      dVar2 = min<double>(0.0,(local_50 / dVar3 - this->B[D._4_4_]) / dStack_18);
      pdStack_38[D._4_4_] = dVar2;
    }
  }
  if (beta != 0.0) {
    operator_delete__((void *)beta);
  }
  return;
}

Assistant:

void Solver_MCSVM_CS::solve_sub_problem(double A_i, int yi, double C_yi, int active_i, double *alpha_new)
{
	int r;
	double *D;

	clone(D, B, active_i);
	if(yi < active_i)
		D[yi] += A_i*C_yi;
	qsort(D, active_i, sizeof(double), compare_double);

	double beta = D[0] - A_i*C_yi;
	for(r=1;r<active_i && beta<r*D[r];r++)
		beta += D[r];
	beta /= r;

	for(r=0;r<active_i;r++)
	{
		if(r == yi)
			alpha_new[r] = min(C_yi, (beta-B[r])/A_i);
		else
			alpha_new[r] = min((double)0, (beta - B[r])/A_i);
	}
	delete[] D;
}